

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesAttGroupInfo.hpp
# Opt level: O2

void __thiscall
xercesc_4_0::XercesAttGroupInfo::addAttDef
          (XercesAttGroupInfo *this,SchemaAttDef *toAdd,bool toClone)

{
  BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *this_00;
  SchemaAttDef *this_01;
  
  this_00 = &this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>;
  if (this_00 == (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    this_00 = (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)
              XMemory::operator_new(0x30,this->fMemoryManager);
    RefVectorOf<xercesc_4_0::SchemaAttDef>::RefVectorOf
              ((RefVectorOf<xercesc_4_0::SchemaAttDef> *)this_00,4,true,this->fMemoryManager);
    this->fAttributes = (RefVectorOf<xercesc_4_0::SchemaAttDef> *)this_00;
  }
  if (toClone) {
    this_01 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fMemoryManager);
    SchemaAttDef::SchemaAttDef(this_01,toAdd);
    if (this_01->fBaseAttDecl == (SchemaAttDef *)0x0) {
      this_01->fBaseAttDecl = toAdd;
    }
    this_00 = &this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>;
    toAdd = this_01;
  }
  BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::addElement(this_00,toAdd);
  return;
}

Assistant:

inline void XercesAttGroupInfo::addAttDef(SchemaAttDef* const toAdd,
                                             const bool toClone) {

    if (!fAttributes) {
        fAttributes = new (fMemoryManager) RefVectorOf<SchemaAttDef>(4, true, fMemoryManager);
    }

    if (toClone) {
        SchemaAttDef* clonedAttDef = new (fMemoryManager) SchemaAttDef(toAdd);

        if (!clonedAttDef->getBaseAttDecl())
            clonedAttDef->setBaseAttDecl(toAdd);

        fAttributes->addElement(clonedAttDef);
    }
    else {
        fAttributes->addElement(toAdd);
    }
}